

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linkValidate.cpp
# Opt level: O1

void __thiscall
glslang::TIntermediate::remapIds
          (TIntermediate *this,TIdMaps *idMaps,longlong idShift,TIntermediate *unit)

{
  TRemapIdTraverser idTraverser;
  undefined **local_70;
  undefined1 local_68;
  undefined7 local_67;
  undefined4 uStack_60;
  TPoolAllocator *local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  TIdMaps *local_38;
  longlong local_30;
  
  local_70 = &PTR__TIntermTraverser_00b096d8;
  local_68 = 1;
  local_58 = (TPoolAllocator *)0x0;
  uStack_50 = 0;
  local_48 = 0;
  uStack_40 = 0;
  local_67 = 0;
  uStack_60 = 0;
  local_58 = GetThreadPoolAllocator();
  uStack_50 = 0;
  local_48 = 0;
  uStack_40 = 0;
  local_70 = &PTR__TIntermTraverser_00b099d0;
  local_38 = idMaps;
  local_30 = idShift;
  (*unit->treeRoot->_vptr_TIntermNode[2])(unit->treeRoot,&local_70);
  return;
}

Assistant:

void TIntermediate::remapIds(const TIdMaps& idMaps, long long idShift, TIntermediate& unit)
{
    // Remap all IDs to either share or be unique, as dictated by the idMap and idShift.
    TRemapIdTraverser idTraverser(idMaps, idShift);
    unit.getTreeRoot()->traverse(&idTraverser);
}